

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

p_ply_property ply_grow_property(p_ply ply,p_ply_element element)

{
  p_ply_property ptVar1;
  
  if (element == (p_ply_element)0x0) {
    __assert_fail("element",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x4a2,"p_ply_property ply_grow_property(p_ply, p_ply_element)");
  }
  if (element->property == (p_ply_property)0x0) {
    if (element->nproperties != 0) {
      __assert_fail("element->property || element->nproperties == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                    ,0x4a3,"p_ply_property ply_grow_property(p_ply, p_ply_element)");
    }
  }
  else if (element->nproperties < 1) {
    __assert_fail("!element->property || element->nproperties > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x4a4,"p_ply_property ply_grow_property(p_ply, p_ply_element)");
  }
  ptVar1 = (p_ply_property)ply_grow_array(ply,&element->property,&element->nproperties,0x128);
  if (ptVar1 == (p_ply_property)0x0) {
    ptVar1 = (p_ply_property)0x0;
  }
  else {
    ptVar1->name[0] = '\0';
    ptVar1->type = ~PLY_INT8;
    ptVar1->value_type = ~PLY_INT8;
    ptVar1->length_type = ~PLY_INT8;
    ptVar1->read_cb = (p_ply_read_cb)0x0;
    ptVar1->pdata = (void *)0x0;
    ptVar1->idata = 0;
  }
  return ptVar1;
}

Assistant:

static p_ply_property ply_grow_property(p_ply ply, p_ply_element element) {
    p_ply_property property = NULL;
    assert(ply);
    assert(element);
    assert(element->property || element->nproperties == 0);
    assert(!element->property || element->nproperties > 0);
    property = (p_ply_property) ply_grow_array(ply,
            (void **) &element->property,
            &element->nproperties, sizeof(t_ply_property));
    if (!property) return NULL;
    ply_property_init(property);
    return property;
}